

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::
ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *msg2,int value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  ostream *poVar1;
  ostringstream s;
  int local_1cc;
  string local_1c8;
  outputter<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1a8;
  ostringstream local_1a0 [376];
  
  local_1cc = value;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (msg->_M_string_length != 0) {
    local_1c8._M_dataplus._M_p = (pointer)msg;
    poVar1 = details::operator<<((ostream *)local_1a0,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1c8);
    std::operator<<(poVar1,". ");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)msg2);
  std::operator<<(poVar1," ");
  local_1c8._M_dataplus._M_p = (pointer)&local_1cc;
  details::operator<<((ostream *)local_1a0,(expected_got_outputter<int> *)&local_1c8);
  std::operator<<((ostream *)local_1a0,", actual contents :\n\t");
  local_1c8._M_dataplus._M_p = (pointer)begin._M_current;
  local_1c8._M_string_length = (size_type)end._M_current;
  local_1a8.t = (Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_1c8;
  stream_any_details::operator<<((ostream *)local_1a0,&local_1a8);
  std::operator<<((ostream *)local_1a0,"\n");
  std::__cxx11::stringbuf::str();
  Error(this,&local_1c8);
}

Assistant:

[[noreturn]] void ContainmentError(const std::string& msg, const std::string& msg2, Value value,
            ContainerIterator begin, ContainerIterator end) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
                s << stream(msg) << ". ";

            s << msg2 << " ";
            s << stream(value);
            s << ", actual contents :\n\t";
            s << stream_any(Range<ContainerIterator>(begin, end));
            s << "\n";
            Error(s.str());
        }